

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O0

void output_velocities(FILE *fdf,char *s,float (*full_velocities) [512] [2],int pic_x,int pic_y,
                      int n)

{
  float fVar1;
  size_t sVar2;
  uint local_48;
  uint local_44;
  int no_vals;
  int no_novals;
  int bytes;
  int j;
  int i;
  float y;
  float x;
  int n_local;
  int pic_y_local;
  int pic_x_local;
  float (*full_velocities_local) [512] [2];
  char *s_local;
  FILE *fdf_local;
  
  y = (float)n;
  x = (float)pic_y;
  n_local = pic_x;
  _pic_y_local = full_velocities;
  full_velocities_local = (float (*) [512] [2])s;
  s_local = (char *)fdf;
  if (fdf != (FILE *)0x0) {
    j = (int)(float)pic_x;
    i = (int)(float)pic_y;
    fwrite(&i,4,1,(FILE *)fdf);
    fwrite(&j,4,1,(FILE *)s_local);
    j = (int)(float)(n_local + (int)y * -2);
    i = (int)(float)((int)x + (int)y * -2);
    fwrite(&i,4,1,(FILE *)s_local);
    fwrite(&j,4,1,(FILE *)s_local);
    j = (int)(float)(int)y;
    i = (int)(float)(int)y;
    fwrite(&i,4,1,(FILE *)s_local);
    fwrite(&j,4,1,(FILE *)s_local);
    no_vals = 0x18;
    local_48 = 0;
    local_44 = 0;
    for (bytes = (int)y; bytes < n_local - (int)y; bytes = bytes + 1) {
      for (no_novals = (int)y; no_novals < (int)x - (int)y; no_novals = no_novals + 1) {
        fVar1 = _pic_y_local[bytes][no_novals][0];
        if (((fVar1 == 100.0) && (!NAN(fVar1))) ||
           ((fVar1 = _pic_y_local[bytes][no_novals][1], fVar1 == 100.0 && (!NAN(fVar1))))) {
          local_44 = local_44 + 1;
        }
        else {
          local_48 = local_48 + 1;
        }
      }
    }
    for (bytes = (int)y; bytes < n_local - (int)y; bytes = bytes + 1) {
      sVar2 = fwrite(_pic_y_local[bytes] + (int)y,4,(long)(((int)x + (int)y * -2) * 2),
                     (FILE *)s_local);
      no_vals = no_vals + (int)sVar2;
    }
    fclose((FILE *)s_local);
    printf("\n%s velocities output from output_velocities: %d velocities\n",full_velocities_local,
           (ulong)(uint)no_vals);
    printf("Number of positions with velocity: %d\n",(ulong)local_48);
    printf("Number of positions without velocity: %d\n",(ulong)local_44);
    printf("Percentage of %s velocities: %f\n",
           ((double)(int)local_48 / ((double)(int)(local_48 + local_44) * 1.0)) * 100.0,
           full_velocities_local);
    fflush(_stdout);
    return;
  }
  printf("\nFatal error: full velocity file not opened\n");
  exit(1);
}

Assistant:

void output_velocities(FILE *fdf, char s[],
float full_velocities[PIC_X][PIC_Y][2],
int pic_x, int pic_y,
int n)
{
float x,y;
int i,j,bytes,no_novals,no_vals;

//int NORMAL = FALSE;
//if(strcmp(s,"Normal")==0) NORMAL = TRUE;
if(fdf==NULL)
	{
	printf("\nFatal error: full velocity file not opened\n");
	exit(1);
	}
/* original size */
y = (float) pic_x;
x = (float) pic_y;
fwrite(&x,4, 1, fdf);
fwrite(&y,4, 1, fdf);

/* size of result data */
y = (float) (pic_x-2*n);
x = (float) (pic_y-2*n);
fwrite(&x,4, 1, fdf);
fwrite(&y,4, 1, fdf);

/* offset to start of data */
y = (float) n;
x = (float) n;
fwrite(&x,4, 1, fdf);
fwrite(&y,4, 1, fdf);
bytes = 24;

no_novals = no_vals = 0;
/* Prepare velocities for output, i.e. rotate by 90 degrees */
for(i=n;i<pic_x-n;i++)
for(j=n;j<pic_y-n;j++)
	{
	if(full_velocities[i][j][0] != NO_VALUE &&
	   full_velocities[i][j][1] != NO_VALUE)
		{
		no_vals++;
		}
	else
		{
		no_novals++;
		}
	}
for(i=n;i<pic_x-n;i++)
	{
	bytes += fwrite(&full_velocities[i][n][0], 4, (pic_y-2*n)*2, fdf);
	}
fclose(fdf);
printf("\n%s velocities output from output_velocities: %d velocities\n",s,bytes);
printf("Number of positions with velocity: %d\n",no_vals);
printf("Number of positions without velocity: %d\n",no_novals);
printf("Percentage of %s velocities: %f\n",s,
	no_vals/(1.0*(no_vals+no_novals))*100.0);
fflush(stdout);
}